

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  uint *puVar1;
  long lVar2;
  iterator iVar3;
  long lVar4;
  size_t in_RCX;
  size_t start_memory;
  uint uVar5;
  ulong uVar6;
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  key_type local_78;
  long local_70;
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  uVar5 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (iters < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    uVar5 = 1;
    lVar2 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_78.buffer_ = (char  [4])((uVar5 & 0xff) * 0x1010101);
      local_78.i_ = uVar5;
      puVar1 = (uint *)std::__detail::
                       _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&local_68,&local_78);
      uVar5 = uVar5 + 1;
      *puVar1 = uVar5;
    } while (iters != uVar5);
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar2 = std::chrono::_V2::steady_clock::now();
    if (iters < 1) {
      uVar5 = 1;
    }
    else {
      uVar5 = 1;
      uVar6 = 0;
      local_70 = lVar2;
      do {
        local_78.i_ = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
        local_78.buffer_ = (char  [4])((local_78.i_ & 0xffU) * 0x1010101);
        iVar3 = std::
                _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_68,&local_78);
        in_RCX = (size_t)(iVar3.
                          super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>.
                          _M_cur != (__node_type *)0x0);
        uVar5 = uVar5 ^ iVar3.
                        super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
        uVar6 = uVar6 + 1;
        lVar2 = local_70;
      } while ((uint)iters != uVar6);
    }
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  srand(uVar5);
  report(title,(double)(lVar4 - lVar2),iters,start_memory,in_RCX);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}